

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O1

void __thiscall Potassco::AspifTextInput::matchStr(AspifTextInput *this)

{
  char cVar1;
  byte bVar2;
  BufferedStream *pBVar3;
  bool bVar4;
  
  match(this,"\"",true);
  std::__cxx11::string::_M_replace_aux
            ((ulong)&this->data_->symbol,(this->data_->symbol)._M_string_length,0,'\x01');
  pBVar3 = ProgramReader::stream(&this->super_ProgramReader);
  cVar1 = pBVar3->buf_[pBVar3->rpos_];
  if ((cVar1 != '\0') && (cVar1 != '\"')) {
    bVar2 = 0;
    do {
      bVar4 = cVar1 == '\\';
      pBVar3 = ProgramReader::stream(&this->super_ProgramReader);
      BufferedStream::get(pBVar3);
      std::__cxx11::string::_M_replace_aux
                ((ulong)&this->data_->symbol,(this->data_->symbol)._M_string_length,0,'\x01');
      pBVar3 = ProgramReader::stream(&this->super_ProgramReader);
      cVar1 = pBVar3->buf_[pBVar3->rpos_];
      if (cVar1 == '\0') break;
      bVar2 = (bVar2 ^ 1) & bVar4;
    } while ((bool)(cVar1 != '\"' | bVar2));
  }
  match(this,"\"",true);
  std::__cxx11::string::_M_replace_aux
            ((ulong)&this->data_->symbol,(this->data_->symbol)._M_string_length,0,'\x01');
  return;
}

Assistant:

void AspifTextInput::matchStr() {
	match("\""), push('"');
	bool quoted = false;
	for (char c; (c = stream()->peek()) != 0 && (c != '\"' || quoted);) {
		quoted = !quoted && c == '\\';
		push(stream()->get());
	}
	match("\""), push('"');
}